

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseAccess.cpp
# Opt level: O2

int __thiscall bhf::ads::LicenseAccess::ShowSystemId(LicenseAccess *this,ostream *os)

{
  long lVar1;
  ostream *poVar2;
  uint uVar3;
  uint32_t bytesRead;
  vector<unsigned_char,_std::allocator<unsigned_char>_> readBuffer;
  string local_1d8;
  char buf [38];
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&readBuffer,0x10,(allocator_type *)buf);
  bytesRead = 0;
  uVar3 = 1;
  lVar1 = AdsDevice::ReadReqEx2
                    (&this->device,0x1010004,1,
                     (long)readBuffer.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)readBuffer.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                     readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,&bytesRead);
  if (lVar1 == 0) {
    snprintf(buf,0x26,"%02X%02X%02X%02X-%02X%02X-%02X%02X-%02X%02X-%02X%02X%02X%02X%02X%02X\n",
             (ulong)readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[3],
             (ulong)readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[2],
             (ulong)readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[1],
             (ulong)*readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
             (ulong)readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[5],
             (ulong)readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[4],
             (ulong)readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[7],
             (ulong)readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[6],
             (ulong)readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[8],
             (ulong)readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[9],
             (ulong)readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[10],
             (ulong)readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[0xb],
             (ulong)readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[0xc],
             (ulong)readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[0xd],
             (ulong)readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[0xe],
             (ulong)readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[0xf]);
    std::operator<<(os,buf);
    uVar3 = (uint)(*(int *)(os + *(long *)(*(long *)os + -0x18) + 0x20) != 0);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)buf);
    poVar2 = std::operator<<((ostream *)(buf + 0x10),"ShowSystemId");
    poVar2 = std::operator<<(poVar2,"(): failed with: 0x");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::operator<<(poVar2,'\n');
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::stringstream::~stringstream((stringstream *)buf);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return uVar3;
}

Assistant:

int LicenseAccess::ShowSystemId(std::ostream& os) const
{
    std::vector<uint8_t> readBuffer(16);
    uint32_t bytesRead = 0;
    const auto status = device.ReadReqEx2(0x01010004,
                                          0x1,
                                          readBuffer.size(),
                                          readBuffer.data(),
                                          &bytesRead);
    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
        return 1;
    }
    char buf[38];
    snprintf(buf, sizeof(buf), "%02X%02X%02X%02X-%02X%02X-%02X%02X-%02X%02X-%02X%02X%02X%02X%02X%02X\n"
             , readBuffer[3], readBuffer[2], readBuffer[1], readBuffer[0]
             , readBuffer[5], readBuffer[4]
             , readBuffer[7], readBuffer[6]
             , readBuffer[8], readBuffer[9]
             , readBuffer[10], readBuffer[11], readBuffer[12], readBuffer[13], readBuffer[14], readBuffer[15]
             );
    os << buf;
    return !os.good();
}